

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  curl_socket_t sockfd;
  void *pvVar1;
  connectdata *conn;
  bool bVar2;
  int iVar3;
  uint scope;
  int *piVar4;
  bool bVar5;
  curltime cVar6;
  undefined4 uStack_44;
  undefined4 uStack_34;
  CURLcode local_2c;
  _Bool is_tcp;
  CURLcode result;
  _Bool isconnected;
  int error;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  bVar2 = false;
  cVar6 = Curl_now();
  *(time_t *)((long)pvVar1 + 0x100) = cVar6.tv_sec;
  *(ulong *)((long)pvVar1 + 0x108) = CONCAT44(uStack_34,cVar6.tv_usec);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(uint *)((long)pvVar1 + 0xc) = *(uint *)((long)pvVar1 + 0xc) | 0x800;
  }
  local_2c = socket_open(data,(Curl_sockaddr_ex *)((long)pvVar1 + 8),
                         (curl_socket_t *)((long)pvVar1 + 0x98));
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(uint *)((long)pvVar1 + 0xc) = *(uint *)((long)pvVar1 + 0xc) & 0xfffff7ff;
  }
  if ((local_2c == CURLE_OK) && (local_2c = set_remote_ip(cf,data), local_2c == CURLE_OK)) {
    if (*(int *)((long)pvVar1 + 8) == 10) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"  Trying [%s]:%d...",(long)pvVar1 + 0x9c,
                   (ulong)*(uint *)((long)pvVar1 + 0xf8));
      }
    }
    else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
      Curl_infof(data,"  Trying %s:%d...",(long)pvVar1 + 0x9c,(ulong)*(uint *)((long)pvVar1 + 0xf8))
      ;
    }
    if ((*(int *)((long)pvVar1 + 8) == 2) || (bVar5 = false, *(int *)((long)pvVar1 + 8) == 10)) {
      bVar5 = *(int *)((long)pvVar1 + 0xc) == 1;
    }
    if ((bVar5) && ((*(ulong *)&(data->set).field_0x894 >> 0x22 & 1) != 0)) {
      tcpnodelay(data,*(curl_socket_t *)((long)pvVar1 + 0x98));
    }
    if ((bVar5) && ((*(ulong *)&(data->set).field_0x894 >> 0x28 & 1) != 0)) {
      tcpkeepalive(data,*(curl_socket_t *)((long)pvVar1 + 0x98));
    }
    if ((data->set).fsockopt != (curl_sockopt_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar3 = (*(data->set).fsockopt)
                        ((data->set).sockopt_client,*(curl_socket_t *)((long)pvVar1 + 0x98),
                         CURLSOCKTYPE_IPCXN);
      Curl_set_in_callback(data,false);
      if (iVar3 == 2) {
        bVar2 = true;
      }
      else if (iVar3 != 0) {
        local_2c = CURLE_ABORTED_BY_CALLBACK;
        goto LAB_0011c1c2;
      }
    }
    if ((*(int *)((long)pvVar1 + 8) == 2) || (*(int *)((long)pvVar1 + 8) == 10)) {
      conn = cf->conn;
      sockfd = *(curl_socket_t *)((long)pvVar1 + 0x98);
      iVar3 = *(int *)((long)pvVar1 + 8);
      scope = Curl_ipv6_scope((sockaddr *)((long)pvVar1 + 0x18));
      local_2c = bindlocal(data,conn,sockfd,iVar3,scope);
      if (local_2c != CURLE_OK) {
        if (local_2c == CURLE_UNSUPPORTED_PROTOCOL) {
          local_2c = CURLE_COULDNT_CONNECT;
        }
        goto LAB_0011c1c2;
      }
    }
    if (((data->set).fopensocket == (curl_opensocket_callback)0x0) ||
       (iVar3 = curlx_nonblock(*(curl_socket_t *)((long)pvVar1 + 0x98),1), -1 < iVar3)) {
      *(byte *)((long)pvVar1 + 0x134) =
           *(byte *)((long)pvVar1 + 0x134) & 0xf7 | (*(int *)((long)pvVar1 + 0xc) != 2) << 3;
    }
    else {
      local_2c = CURLE_UNSUPPORTED_PROTOCOL;
      piVar4 = __errno_location();
      *(int *)((long)pvVar1 + 0x130) = *piVar4;
    }
  }
LAB_0011c1c2:
  if (local_2c == CURLE_OK) {
    if (bVar2) {
      set_local_ip(cf,data);
      cVar6 = Curl_now();
      *(time_t *)((long)pvVar1 + 0x110) = cVar6.tv_sec;
      *(ulong *)((long)pvVar1 + 0x118) = CONCAT44(uStack_44,cVar6.tv_usec);
      cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    }
  }
  else if (*(int *)((long)pvVar1 + 0x98) != -1) {
    socket_close(data,cf->conn,1,*(curl_socket_t *)((long)pvVar1 + 0x98));
    *(undefined4 *)((long)pvVar1 + 0x98) = 0xffffffff;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)local_2c,
                      (ulong)*(uint *)((long)pvVar1 + 0x98));
  }
  return local_2c;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
#ifdef SOCK_NONBLOCK
  /* Do not tuck SOCK_NONBLOCK into socktype when opensocket callback is set
   * because we would not know how socketype is about to be used in the
   * callback, SOCK_NONBLOCK might get factored out before calling socket().
   */
  if(!data->set.fopensocket)
    ctx->addr.socktype |= SOCK_NONBLOCK;
#endif
  result = socket_open(data, &ctx->addr, &ctx->sock);
#ifdef SOCK_NONBLOCK
  /* Restore the socktype after the socket is created. */
  if(!data->set.fopensocket)
    ctx->addr.socktype &= ~SOCK_NONBLOCK;
#endif
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef USE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);

#ifdef USE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbuf_init(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, TRUE);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, FALSE);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef USE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.curl_sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

#ifndef SOCK_NONBLOCK
  /* Set socket non-blocking, must be a non-blocking socket for
   * a non-blocking connect. */
  error = curlx_nonblock(ctx->sock, TRUE);
  if(error < 0) {
    result = CURLE_UNSUPPORTED_PROTOCOL;
    ctx->error = SOCKERRNO;
    goto out;
  }
#else
  if(data->set.fopensocket) {
    /* Set socket non-blocking, must be a non-blocking socket for
     * a non-blocking connect. */
    error = curlx_nonblock(ctx->sock, TRUE);
    if(error < 0) {
      result = CURLE_UNSUPPORTED_PROTOCOL;
      ctx->error = SOCKERRNO;
      goto out;
    }
  }
#endif
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" FMT_SOCKET_T,
              result, ctx->sock);
  return result;
}